

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lyd_parser_set_data_flags
                 (lyd_node *node,lyd_meta **meta,lyd_ctx *lydctx,lysc_ext_instance *ext)

{
  uint uVar1;
  lyd_meta *plVar2;
  LY_ERR LVar3;
  int iVar4;
  lysc_when *plVar5;
  lyd_meta *meta_00;
  undefined8 *object;
  lys_module *plVar6;
  lyd_node_inner *parent;
  lyd_meta *plVar7;
  
  if ((lydctx->parse_opts & 0x1000000) != 0) {
    *(byte *)&node->flags = (byte)node->flags & 0xfb;
  }
  plVar5 = lysc_has_when(node->schema);
  if (plVar5 != (lysc_when *)0x0) {
    uVar1 = lydctx->parse_opts;
    if ((uVar1 >> 0x17 & 1) != 0) {
      *(byte *)&node->flags = (byte)node->flags | 2;
    }
    if (((uVar1 >> 0x10 & 1) == 0) &&
       (LVar3 = ly_set_add(&lydctx->node_when,node,'\x01',(uint32_t *)0x0), LVar3 != LY_SUCCESS)) {
      return LVar3;
    }
  }
  if (*meta != (lyd_meta *)0x0) {
    plVar2 = *meta;
    plVar7 = (lyd_meta *)0x0;
    do {
      meta_00 = plVar2;
      iVar4 = strcmp(meta_00->name,"default");
      if (((iVar4 == 0) &&
          (iVar4 = strcmp(meta_00->annotation->module->name,"ietf-netconf-with-defaults"),
          iVar4 == 0)) && ((meta_00->value).field_2.boolean != '\0')) {
        *(byte *)&node->flags = (byte)node->flags | 1;
        plVar2 = meta_00->next;
        if (&node->meta != meta) {
          *meta = (*meta)->next;
        }
        lyd_free_meta_single(meta_00);
        if (plVar7 != (lyd_meta *)0x0) {
          plVar7->next = plVar2;
        }
        if (node == (lyd_node *)0x0) {
          parent = (lyd_node_inner *)0x0;
        }
        else {
          parent = node->parent;
        }
        lyd_np_cont_dflt_set((lyd_node *)parent);
        break;
      }
      plVar2 = meta_00->next;
      plVar7 = meta_00;
    } while (meta_00->next != (lyd_meta *)0x0);
  }
  if ((ext != (lysc_ext_instance *)0x0) &&
     (*(byte *)&node->flags = (byte)node->flags | 8, (lydctx->parse_opts & 0x10000) == 0)) {
    object = (undefined8 *)malloc(0x10);
    if (object == (undefined8 *)0x0) {
      if (node->schema == (lysc_node *)0x0) {
        plVar6 = (lys_module *)&node[2].schema;
      }
      else {
        plVar6 = node->schema->module;
      }
      ly_log(plVar6->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_parser_set_data_flags");
      return LY_EMEM;
    }
    *object = ext;
    object[1] = node;
    LVar3 = ly_set_add(&lydctx->ext_val,object,'\x01',(uint32_t *)0x0);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_parser_set_data_flags(struct lyd_node *node, struct lyd_meta **meta, struct lyd_ctx *lydctx,
        struct lysc_ext_instance *ext)
{
    struct lyd_meta *meta2, *prev_meta = NULL, *next_meta = NULL;
    struct lyd_ctx_ext_val *ext_val;

    if (lydctx->parse_opts & LYD_PARSE_NO_NEW) {
        node->flags &= ~LYD_NEW;
    }

    if (lysc_has_when(node->schema)) {
        if (lydctx->parse_opts & LYD_PARSE_WHEN_TRUE) {
            /* the condition was true before */
            node->flags |= LYD_WHEN_TRUE;
        }
        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* remember we need to evaluate this node's when */
            LY_CHECK_RET(ly_set_add(&lydctx->node_when, node, 1, NULL));
        }
    }

    LY_LIST_FOR(*meta, meta2) {
        if (!strcmp(meta2->name, "default") && !strcmp(meta2->annotation->module->name, "ietf-netconf-with-defaults") &&
                meta2->value.boolean) {
            /* node is default according to the metadata */
            node->flags |= LYD_DEFAULT;

            next_meta = meta2->next;

            /* delete the metadata */
            if (meta != &node->meta) {
                *meta = (*meta)->next;
            }
            lyd_free_meta_single(meta2);
            if (prev_meta) {
                prev_meta->next = next_meta;
            }

            /* update dflt flag for all parent NP containers */
            lyd_np_cont_dflt_set(lyd_parent(node));
            break;
        }

        prev_meta = meta2;
    }

    if (ext) {
        /* parsed for an extension */
        node->flags |= LYD_EXT;

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* rememeber for validation */
            ext_val = malloc(sizeof *ext_val);
            LY_CHECK_ERR_RET(!ext_val, LOGMEM(LYD_CTX(node)), LY_EMEM);
            ext_val->ext = ext;
            ext_val->sibling = node;
            LY_CHECK_RET(ly_set_add(&lydctx->ext_val, ext_val, 1, NULL));
        }
    }

    return LY_SUCCESS;
}